

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<Assimp::SpatialSort::Entry*,std::vector<Assimp::SpatialSort::Entry,std::allocator<Assimp::SpatialSort::Entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  fVar1 = *(float *)(__a + 2);
  fVar2 = *(float *)(__b + 2);
  fVar3 = *(float *)(__c + 2);
  if (fVar2 <= fVar1) {
    if (fVar3 <= fVar1) {
      if (fVar2 < fVar3) goto LAB_003aaf35;
      goto LAB_003aaf60;
    }
  }
  else {
    if (fVar2 < fVar3) {
LAB_003aaf60:
      uVar4 = *(undefined4 *)(__result + 2);
      uVar5 = *__result;
      uVar6 = __result[1];
      *(undefined4 *)(__result + 2) = *(undefined4 *)(__b + 2);
      uVar7 = __b[1];
      *__result = *__b;
      __result[1] = uVar7;
      *(undefined4 *)(__b + 2) = uVar4;
      *__b = uVar5;
      __b[1] = uVar6;
      return;
    }
    if (fVar1 < fVar3) {
LAB_003aaf35:
      uVar4 = *(undefined4 *)(__result + 2);
      uVar5 = *__result;
      uVar6 = __result[1];
      *(undefined4 *)(__result + 2) = *(undefined4 *)(__c + 2);
      uVar7 = __c[1];
      *__result = *__c;
      __result[1] = uVar7;
      *(undefined4 *)(__c + 2) = uVar4;
      *__c = uVar5;
      __c[1] = uVar6;
      return;
    }
  }
  uVar4 = *(undefined4 *)(__result + 2);
  uVar5 = *__result;
  uVar6 = __result[1];
  *(undefined4 *)(__result + 2) = *(undefined4 *)(__a + 2);
  uVar7 = __a[1];
  *__result = *__a;
  __result[1] = uVar7;
  *(undefined4 *)(__a + 2) = uVar4;
  *__a = uVar5;
  __a[1] = uVar6;
  return;
}

Assistant:

bool operator < (const Entry& e) const { return mDistance < e.mDistance; }